

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.y
# Opt level: O3

void __thiscall DocumentStorage::~DocumentStorage(DocumentStorage *this)

{
  Element *this_00;
  long lVar1;
  long lVar2;
  ulong uVar3;
  
  lVar1 = *(long *)this;
  lVar2 = *(long *)&this->field_0x8;
  if (lVar2 != lVar1) {
    uVar3 = 0;
    do {
      this_00 = *(Element **)(lVar1 + uVar3 * 8);
      if (this_00 != (Element *)0x0) {
        Element::~Element(this_00);
        operator_delete(this_00);
        lVar1 = *(long *)this;
        lVar2 = *(long *)&this->field_0x8;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)(lVar2 - lVar1 >> 3));
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Element_*>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Element_*>_>_>
               *)&this->tagmap);
  if (*(void **)this != (void *)0x0) {
    operator_delete(*(void **)this);
    return;
  }
  return;
}

Assistant:

DocumentStorage::~DocumentStorage(void)

{
  for(int4 i=0;i<doclist.size();++i) {
    if (doclist[i] != (Document *)0)
      delete doclist[i];
  }
}